

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O3

void write_slot(MultiPCM *ptChip,slot_t *slot,INT32 reg,UINT8 data)

{
  UINT8 data_00;
  uint uVar1;
  UINT8 *pUVar2;
  byte bVar3;
  UINT32 UVar4;
  INT32 IVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  UINT32 *pUVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  UINT32 *pUVar14;
  
  while (slot->regs[reg] = data, reg == 1) {
    pUVar2 = ptChip->ROM;
    uVar8 = (ulong)(((slot->regs[2] & 1) * 0x400 + (uint)slot->regs[1] * 4) * 3 & ptChip->ROMMask);
    (slot->sample).start =
         (uint)pUVar2[uVar8 + 2] | (uint)pUVar2[uVar8 + 1] << 8 | (uint)pUVar2[uVar8] << 0x10;
    (slot->sample).loop =
         ((*(ushort *)(pUVar2 + uVar8 + 3) & 0xff00) << 8 |
         (uint)*(ushort *)(pUVar2 + uVar8 + 3) << 0x18) >> 0x10;
    (slot->sample).end =
         (ushort)(*(ushort *)(pUVar2 + uVar8 + 5) << 8 | *(ushort *)(pUVar2 + uVar8 + 5) >> 8) ^
         0xffff;
    (slot->sample).attack_reg = pUVar2[uVar8 + 8] >> 4;
    (slot->sample).decay1_reg = pUVar2[uVar8 + 8] & 0xf;
    (slot->sample).decay2_reg = pUVar2[uVar8 + 9] & 0xf;
    (slot->sample).decay_level = pUVar2[uVar8 + 9] >> 4;
    (slot->sample).release_reg = pUVar2[uVar8 + 10] & 0xf;
    (slot->sample).key_rate_scale = pUVar2[uVar8 + 10] >> 4;
    data_00 = pUVar2[uVar8 + 7];
    (slot->sample).lfo_vibrato_reg = data_00;
    (slot->sample).lfo_amplitude_reg = pUVar2[uVar8 + 0xb] & 0xf;
    write_slot(ptChip,slot,6,data_00);
    data = (slot->sample).lfo_amplitude_reg;
    reg = 7;
  }
  switch(reg) {
  case 0:
    slot->pan = (uint)(data >> 4);
    break;
  case 2:
  case 3:
    bVar3 = (slot->regs[3] >> 4) - 1 & 0xf;
    uVar1 = *(uint *)((long)ptChip->freq_step_table +
                     (ulong)((slot->regs[3] & 0xf) << 8 | slot->regs[2] & 0xfffffffc));
    uVar7 = uVar1 << bVar3;
    if (7 < bVar3) {
      uVar7 = uVar1 >> (0x10 - bVar3 & 0x1f);
    }
    slot->step = (UINT32)(long)((float)uVar7 / ptChip->rate);
    break;
  case 4:
    if ((char)data < '\0') {
      slot->playing = '\x01';
      uVar1 = (slot->sample).start;
      slot->base = uVar1;
      iVar6 = 0;
      slot->offset = 0;
      slot->prev_sample = 0;
      slot->total_level = slot->dest_total_level << 0xc;
      uVar7 = (uint)(slot->sample).key_rate_scale;
      if (uVar7 != 0xf) {
        uVar10 = (slot->regs[3] >> 4) - 1 & 0xf;
        uVar12 = uVar10 + 0x7ffffff0;
        if ((byte)uVar10 < 8) {
          uVar12 = uVar10;
        }
        iVar6 = (slot->regs[3] >> 3 & 1) + (uVar12 + uVar7) * 2;
      }
      pUVar9 = ptChip->attack_step;
      bVar3 = (slot->sample).attack_reg;
      if (bVar3 != 0) {
        if (bVar3 == 0xf) {
          pUVar9 = ptChip->attack_step + 0x3f;
        }
        else {
          iVar11 = iVar6 + (uint)bVar3 * 4;
          iVar13 = 0x3f;
          if (iVar11 < 0x3f) {
            iVar13 = iVar11;
          }
          pUVar9 = pUVar9 + iVar13;
        }
      }
      (slot->envelope_gen).attack_rate = *pUVar9;
      pUVar9 = ptChip->decay_release_step;
      bVar3 = (slot->sample).decay1_reg;
      pUVar14 = pUVar9;
      if (bVar3 != 0) {
        if (bVar3 == 0xf) {
          pUVar14 = ptChip->decay_release_step + 0x3f;
        }
        else {
          iVar11 = iVar6 + (uint)bVar3 * 4;
          iVar13 = 0x3f;
          if (iVar11 < 0x3f) {
            iVar13 = iVar11;
          }
          pUVar14 = pUVar9 + iVar13;
        }
      }
      (slot->envelope_gen).decay1_rate = *pUVar14;
      bVar3 = (slot->sample).decay2_reg;
      pUVar14 = pUVar9;
      if (bVar3 != 0) {
        if (bVar3 == 0xf) {
          pUVar14 = ptChip->decay_release_step + 0x3f;
        }
        else {
          iVar11 = iVar6 + (uint)bVar3 * 4;
          iVar13 = 0x3f;
          if (iVar11 < 0x3f) {
            iVar13 = iVar11;
          }
          pUVar14 = pUVar9 + iVar13;
        }
      }
      (slot->envelope_gen).decay2_rate = *pUVar14;
      bVar3 = (slot->sample).release_reg;
      if (bVar3 != 0) {
        if (bVar3 == 0xf) {
          pUVar9 = ptChip->decay_release_step + 0x3f;
        }
        else {
          iVar6 = iVar6 + (uint)bVar3 * 4;
          iVar11 = 0x3f;
          if (iVar6 < 0x3f) {
            iVar11 = iVar6;
          }
          pUVar9 = pUVar9 + iVar11;
        }
      }
      (slot->envelope_gen).release_rate = *pUVar9;
      (slot->envelope_gen).decay_level = 0xf - (uint)(slot->sample).decay_level;
      (slot->envelope_gen).volume = 0;
      (slot->envelope_gen).state = ATTACK;
      if ((ptChip->sega_banking != '\0') &&
         (slot->base = uVar1 & 0x1fffff, (uVar1 >> 0x14 & 1) != 0)) {
        if ((uVar1 >> 0x13 & 1) == 0) {
          uVar7 = ptChip->bank0;
        }
        else {
          uVar7 = ptChip->bank1;
        }
        slot->base = uVar1 & 0x7ffff | uVar7;
      }
    }
    else if (slot->playing != '\0') {
      if ((slot->sample).release_reg == '\x0f') {
        slot->playing = '\0';
      }
      else {
        (slot->envelope_gen).state = RELEASE;
      }
    }
    break;
  case 5:
    uVar1 = (uint)(data >> 1);
    slot->dest_total_level = uVar1;
    if ((data & 1) == 0) {
      if (uVar1 < slot->total_level >> 0xc) {
        IVar5 = ptChip->total_level_steps[0];
      }
      else {
        IVar5 = ptChip->total_level_steps[1];
      }
      slot->total_level_step = IVar5;
    }
    else {
      slot->total_level = uVar1 << 0xc;
    }
    break;
  case 6:
  case 7:
    if (data != 0) {
      bVar3 = slot->regs[6];
      UVar4 = (UINT32)(long)(((*(float *)((long)LFO_FREQ + (ulong)(bVar3 >> 1 & 0x1c)) * 256.0) /
                             ptChip->rate) * 256.0);
      (slot->pitch_lfo).phase_step = UVar4;
      (slot->pitch_lfo).table = pitch_table;
      (slot->pitch_lfo).scale = (INT32 *)((long)pitch_scale_tables[0] + (ulong)((bVar3 & 7) << 10));
      bVar3 = slot->regs[7];
      (slot->amplitude_lfo).phase_step = UVar4;
      (slot->amplitude_lfo).table = amplitude_table;
      (slot->amplitude_lfo).scale =
           (INT32 *)((long)amplitude_scale_tables[0] + (ulong)((bVar3 & 7) << 10));
    }
  }
  return;
}

Assistant:

static void write_slot(MultiPCM *ptChip, slot_t *slot, INT32 reg, UINT8 data)
{
	slot->regs[reg] = data;

	switch(reg)
	{
		case 0: // PANPOT
			slot->pan = (data >> 4) & 0xf;
			break;
		case 1: // Sample
			//according to YMF278 sample write causes some base params written to the regs (envelope+lfos)
			//the game should never change the sample while playing.
			// patched to load all sample data here, so registers 6 and 7 aren't overridden by KeyOn -Valley Bell
			init_sample(ptChip, &slot->sample, slot->regs[1] | ((slot->regs[2] & 1) << 8));
			write_slot(ptChip, slot, 6, slot->sample.lfo_vibrato_reg);
			write_slot(ptChip, slot, 7, slot->sample.lfo_amplitude_reg);
			break;
		case 2: //Pitch
		case 3:
			{
				UINT8 oct = ((slot->regs[3] >> 4) - 1) & 0xf;
				UINT32 pitch = ((slot->regs[3] & 0xf) << 6) | (slot->regs[2] >> 2);
				pitch = ptChip->freq_step_table[pitch];
				if (oct & 0x8)
					pitch >>= (16 - oct);
				else
					pitch <<= oct;
				slot->step = pitch / ptChip->rate;
			}
			break;
		case 4:     //KeyOn/Off (and more?)
			if (data & 0x80)       //KeyOn
			{
				slot->playing = 1;
				slot->base = slot->sample.start;
				slot->offset = 0;
				slot->prev_sample = 0;
				slot->total_level = slot->dest_total_level << TL_SHIFT;

				envelope_generator_calc(ptChip, slot);
				slot->envelope_gen.state = ATTACK;
				slot->envelope_gen.volume = 0;

				if (ptChip->sega_banking)
				{
					slot->base &= 0x1fffff;
					if (slot->base & 0x100000)
					{
						if (slot->base & 0x080000)
							slot->base = (slot->base & 0x07ffff) | ptChip->bank1;
						else
							slot->base = (slot->base & 0x07ffff) | ptChip->bank0;
					}
				}

			}
			else
			{
				if (slot->playing)
				{
					if (slot->sample.release_reg != 0xf)
						slot->envelope_gen.state = RELEASE;
					else
						slot->playing = 0;
				}
			}
			break;
		case 5: // TL + Interpolation
			slot->dest_total_level = (data >> 1) & 0x7f;
			if (!(data & 1))   //Interpolate TL
			{
				if ((slot->total_level >> TL_SHIFT) > slot->dest_total_level)
					slot->total_level_step = ptChip->total_level_steps[0]; // decrease
				else
					slot->total_level_step = ptChip->total_level_steps[1]; // increase
			}
			else
			{
				slot->total_level = slot->dest_total_level << TL_SHIFT;
			}
			break;
		case 6: // LFO frequency + Pitch LFO
			if (data)
			{
				lfo_compute_step(ptChip, &slot->pitch_lfo, (slot->regs[6] >> 3) & 7, slot->regs[6] & 7, 0);
				lfo_compute_step(ptChip, &slot->amplitude_lfo, (slot->regs[6] >> 3) & 7, slot->regs[7] & 7, 1);
			}
			break;
		case 7: // Amplitude LFO
			if (data)
			{
				lfo_compute_step(ptChip, &slot->pitch_lfo, (slot->regs[6] >> 3) & 7, slot->regs[6] & 7, 0);
				lfo_compute_step(ptChip, &slot->amplitude_lfo, (slot->regs[6] >> 3) & 7, slot->regs[7] & 7, 1);
			}
			break;
	}
}